

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconv_bigint.cc
# Opt level: O3

int __thiscall
absl::strings_internal::BigUnsigned<84>::ReadFloatMantissa
          (BigUnsigned<84> *this,ParsedFloat *fp,int significant_digits)

{
  ulong uVar1;
  int iVar2;
  
  if (0 < (long)this->size_) {
    memset(this->words_,0,(long)this->size_ << 2);
  }
  this->size_ = 0;
  if (fp->type == kNumber) {
    if (fp->subrange_begin == (char *)0x0) {
      uVar1 = fp->mantissa;
      *(ulong *)this->words_ = uVar1;
      iVar2 = 2;
      if ((uVar1 >> 0x20 != 0) || (iVar2 = 1, (int)uVar1 != 0)) {
        this->size_ = iVar2;
      }
      iVar2 = fp->exponent;
    }
    else {
      iVar2 = ReadDigits(this,fp->subrange_begin,fp->subrange_end,significant_digits);
      iVar2 = iVar2 + fp->literal_exponent;
    }
    return iVar2;
  }
  __assert_fail("fp.type == FloatType::kNumber",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/abseil-cpp/absl/strings/internal/charconv_bigint.cc"
                ,0xae,
                "int absl::strings_internal::BigUnsigned<84>::ReadFloatMantissa(const ParsedFloat &, int) [max_words = 84]"
               );
}

Assistant:

int BigUnsigned<max_words>::ReadFloatMantissa(const ParsedFloat& fp,
                                              int significant_digits) {
  SetToZero();
  assert(fp.type == FloatType::kNumber);

  if (fp.subrange_begin == nullptr) {
    // We already exactly parsed the mantissa, so no more work is necessary.
    words_[0] = fp.mantissa & 0xffffffffu;
    words_[1] = fp.mantissa >> 32;
    if (words_[1]) {
      size_ = 2;
    } else if (words_[0]) {
      size_ = 1;
    }
    return fp.exponent;
  }
  int exponent_adjust =
      ReadDigits(fp.subrange_begin, fp.subrange_end, significant_digits);
  return fp.literal_exponent + exponent_adjust;
}